

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O3

SUNAdaptController SUNAdaptController_ImExGus(SUNContext_conflict sunctx)

{
  SUNAdaptController_Ops p_Var1;
  SUNAdaptController p_Var2;
  undefined8 *puVar3;
  
  p_Var2 = (SUNAdaptController)SUNAdaptController_NewEmpty();
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNAdaptController_GetType_ImExGus;
  p_Var1->estimatestep = SUNAdaptController_EstimateStep_ImExGus;
  p_Var1->reset = SUNAdaptController_Reset_ImExGus;
  p_Var1->setdefaults = SUNAdaptController_SetDefaults_ImExGus;
  p_Var1->write = SUNAdaptController_Write_ImExGus;
  p_Var1->seterrorbias = SUNAdaptController_SetErrorBias_ImExGus;
  p_Var1->updateh = SUNAdaptController_UpdateH_ImExGus;
  p_Var1->space = SUNAdaptController_Space_ImExGus;
  puVar3 = (undefined8 *)malloc(0x40);
  p_Var2->content = puVar3;
  puVar3[2] = 0x3fd77ced916872b0;
  puVar3[3] = 0x3fd126e978d4fdf4;
  *puVar3 = 0x3fee666666666666;
  puVar3[1] = 0x3fee666666666666;
  puVar3[4] = 0x3ff0000000000000;
  puVar3[5] = 0x3ff0000000000000;
  *(undefined4 *)(puVar3 + 7) = 1;
  return p_Var2;
}

Assistant:

SUNAdaptController SUNAdaptController_ImExGus(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C;
  SUNAdaptControllerContent_ImExGus content;

  /* Create an empty controller object */
  C = NULL;
  C = SUNAdaptController_NewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  C->ops->gettype      = SUNAdaptController_GetType_ImExGus;
  C->ops->estimatestep = SUNAdaptController_EstimateStep_ImExGus;
  C->ops->reset        = SUNAdaptController_Reset_ImExGus;
  C->ops->setdefaults  = SUNAdaptController_SetDefaults_ImExGus;
  C->ops->write        = SUNAdaptController_Write_ImExGus;
  C->ops->seterrorbias = SUNAdaptController_SetErrorBias_ImExGus;
  C->ops->updateh      = SUNAdaptController_UpdateH_ImExGus;
  C->ops->space        = SUNAdaptController_Space_ImExGus;

  /* Create content */
  content = NULL;
  content = (SUNAdaptControllerContent_ImExGus)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  C->content = content;

  /* Fill content with default/reset values */
  SUNCheckCallNull(SUNAdaptController_SetDefaults_ImExGus(C));
  SUNCheckCallNull(SUNAdaptController_Reset_ImExGus(C));

  return (C);
}